

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

char * remapShortTimeZone(char *stdID,char *dstID,int32_t daylightType,int32_t offset)

{
  int iVar1;
  int local_2c;
  int32_t idx;
  int32_t offset_local;
  int32_t daylightType_local;
  char *dstID_local;
  char *stdID_local;
  
  local_2c = 0;
  while( true ) {
    if (0x3a < local_2c) {
      return (char *)0x0;
    }
    if ((((offset == OFFSET_ZONE_MAPPINGS[local_2c].offsetSeconds) &&
         (daylightType == OFFSET_ZONE_MAPPINGS[local_2c].daylightType)) &&
        (iVar1 = strcmp(OFFSET_ZONE_MAPPINGS[local_2c].stdID,stdID), iVar1 == 0)) &&
       (iVar1 = strcmp(OFFSET_ZONE_MAPPINGS[local_2c].dstID,dstID), iVar1 == 0)) break;
    local_2c = local_2c + 1;
  }
  return OFFSET_ZONE_MAPPINGS[local_2c].olsonID;
}

Assistant:

static const char* remapShortTimeZone(const char *stdID, const char *dstID, int32_t daylightType, int32_t offset)
{
    int32_t idx;
#ifdef DEBUG_TZNAME
    fprintf(stderr, "TZ=%s std=%s dst=%s daylight=%d offset=%d\n", getenv("TZ"), stdID, dstID, daylightType, offset);
#endif
    for (idx = 0; idx < UPRV_LENGTHOF(OFFSET_ZONE_MAPPINGS); idx++)
    {
        if (offset == OFFSET_ZONE_MAPPINGS[idx].offsetSeconds
            && daylightType == OFFSET_ZONE_MAPPINGS[idx].daylightType
            && strcmp(OFFSET_ZONE_MAPPINGS[idx].stdID, stdID) == 0
            && strcmp(OFFSET_ZONE_MAPPINGS[idx].dstID, dstID) == 0)
        {
            return OFFSET_ZONE_MAPPINGS[idx].olsonID;
        }
    }
    return NULL;
}